

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                 *handler)

{
  width_adapter local_60;
  int local_54;
  specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
  *psStack_50;
  int width;
  specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
  *handler_local;
  char *end_local;
  char *begin_local;
  char local_29;
  width_adapter *pwStack_28;
  char c;
  char *local_20;
  char *local_18;
  char *local_10;
  
  psStack_50 = handler;
  handler_local =
       (specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
        *)end;
  end_local = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/core.h"
                ,0x95f,"");
  }
  if ((*begin < '0') || ('9' < *begin)) {
    if (*begin == '{') {
      end_local = begin + 1;
      if (end_local != end) {
        pwStack_28 = &local_60;
        local_29 = *end_local;
        local_60.handler = handler;
        local_20 = end;
        local_18 = end_local;
        if ((local_29 == '}') || (local_29 == ':')) {
          parse_width<char,_fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>_&>
          ::width_adapter::operator()(pwStack_28);
          local_10 = local_18;
        }
        else {
          local_10 = do_parse_arg_id<char,fmt::v8::detail::parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&)::width_adapter&>
                               (end_local,end,pwStack_28);
        }
        end_local = local_10;
      }
      if (((specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
            *)end_local == handler_local) || (*end_local != '}')) {
        dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
        ::on_error(&psStack_50->
                    super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                   ,"invalid format string");
        return end_local;
      }
      end_local = end_local + 1;
    }
  }
  else {
    local_54 = parse_nonnegative_int<char>(&end_local,end,-1);
    if (local_54 == -1) {
      dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
      ::on_error(&psStack_50->
                  super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ,"number is too big");
    }
    else {
      specs_setter<char>::on_width((specs_setter<char> *)psStack_50,local_54);
    }
  }
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}